

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBJMeshFileLoader.cpp
# Opt level: O1

c8 * __thiscall
irr::scene::COBJMeshFileLoader::readUV
          (COBJMeshFileLoader *this,c8 *bufPtr,vector2df *vec,c8 *bufEnd)

{
  c8 *pcVar1;
  float ret;
  c8 wordBuffer [256];
  float local_13c;
  c8 local_138 [264];
  
  pcVar1 = goAndCopyNextWord(this,local_138,bufPtr,0x100,bufEnd);
  core::fast_atof_move(local_138,(f32 *)&local_13c);
  vec->X = local_13c;
  pcVar1 = goAndCopyNextWord(this,local_138,pcVar1,0x100,bufEnd);
  core::fast_atof_move(local_138,(f32 *)&local_13c);
  vec->Y = 1.0 - local_13c;
  return pcVar1;
}

Assistant:

const c8 *COBJMeshFileLoader::readUV(const c8 *bufPtr, core::vector2df &vec, const c8 *const bufEnd)
{
	const u32 WORD_BUFFER_LENGTH = 256;
	c8 wordBuffer[WORD_BUFFER_LENGTH];

	bufPtr = goAndCopyNextWord(wordBuffer, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
	vec.X = core::fast_atof(wordBuffer);
	bufPtr = goAndCopyNextWord(wordBuffer, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
	vec.Y = 1 - core::fast_atof(wordBuffer); // change handedness
	return bufPtr;
}